

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::CalcListClipping
               (int items_count,float items_height,int *out_items_display_start,
               int *out_items_display_end)

{
  float fVar1;
  float fVar2;
  bool bVar3;
  ImGuiWindow *pIVar4;
  undefined1 auVar5 [16];
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  
  if (GImGui->LogEnabled == true) {
    *out_items_display_start = 0;
  }
  else {
    pIVar4 = GImGui->CurrentWindow;
    if (pIVar4->SkipItems == true) {
      *out_items_display_end = 0;
      *out_items_display_start = 0;
      return;
    }
    fVar1 = (pIVar4->ClipRect).Min.y;
    auVar11 = ZEXT464((uint)fVar1);
    fVar2 = (pIVar4->ClipRect).Max.y;
    auVar10 = ZEXT464((uint)fVar2);
    bVar3 = GImGui->NavMoveRequest;
    if (bVar3 == true) {
      auVar5 = vminss_avx(ZEXT416((uint)(GImGui->NavScoringRect).Min.y),ZEXT416((uint)fVar1));
      auVar11 = ZEXT1664(auVar5);
      auVar5 = vmaxss_avx(ZEXT416((uint)(GImGui->NavScoringRect).Max.y),ZEXT416((uint)fVar2));
      auVar10 = ZEXT1664(auVar5);
    }
    if ((GImGui->NavJustMovedToId != 0) && (pIVar4->NavLastIds[0] == GImGui->NavJustMovedToId)) {
      fVar1 = (pIVar4->Pos).y;
      auVar5 = vminss_avx(ZEXT416((uint)(fVar1 + pIVar4->NavRectRel[0].Min.y)),auVar11._0_16_);
      auVar11 = ZEXT1664(auVar5);
      auVar5 = vmaxss_avx(ZEXT416((uint)(fVar1 + pIVar4->NavRectRel[0].Max.y)),auVar10._0_16_);
      auVar10 = ZEXT1664(auVar5);
    }
    fVar1 = (pIVar4->DC).CursorPos.y;
    iVar8 = (int)((auVar11._0_4_ - fVar1) / items_height);
    if (bVar3 != false) {
      iVar8 = iVar8 - (uint)(GImGui->NavMoveClipDir == 2);
    }
    iVar9 = (int)((auVar10._0_4_ - fVar1) / items_height);
    if (bVar3 != false) {
      iVar9 = iVar9 + (uint)(GImGui->NavMoveClipDir == 3);
    }
    iVar6 = items_count;
    if (iVar8 < items_count) {
      iVar6 = iVar8;
    }
    iVar7 = 0;
    if (-1 < iVar8) {
      iVar7 = iVar6;
    }
    iVar9 = iVar9 + 1;
    if (iVar9 < items_count) {
      items_count = iVar9;
    }
    if (iVar9 < iVar7) {
      items_count = iVar7;
    }
    *out_items_display_start = iVar7;
  }
  *out_items_display_end = items_count;
  return;
}

Assistant:

void ImGui::CalcListClipping(int items_count, float items_height, int* out_items_display_start, int* out_items_display_end)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (g.LogEnabled)
    {
        // If logging is active, do not perform any clipping
        *out_items_display_start = 0;
        *out_items_display_end = items_count;
        return;
    }
    if (window->SkipItems)
    {
        *out_items_display_start = *out_items_display_end = 0;
        return;
    }

    // We create the union of the ClipRect and the NavScoringRect which at worst should be 1 page away from ClipRect
    ImRect unclipped_rect = window->ClipRect;
    if (g.NavMoveRequest)
        unclipped_rect.Add(g.NavScoringRect);
    if (g.NavJustMovedToId && window->NavLastIds[0] == g.NavJustMovedToId)
        unclipped_rect.Add(ImRect(window->Pos + window->NavRectRel[0].Min, window->Pos + window->NavRectRel[0].Max));

    const ImVec2 pos = window->DC.CursorPos;
    int start = (int)((unclipped_rect.Min.y - pos.y) / items_height);
    int end = (int)((unclipped_rect.Max.y - pos.y) / items_height);

    // When performing a navigation request, ensure we have one item extra in the direction we are moving to
    if (g.NavMoveRequest && g.NavMoveClipDir == ImGuiDir_Up)
        start--;
    if (g.NavMoveRequest && g.NavMoveClipDir == ImGuiDir_Down)
        end++;

    start = ImClamp(start, 0, items_count);
    end = ImClamp(end + 1, start, items_count);
    *out_items_display_start = start;
    *out_items_display_end = end;
}